

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::q_relocate_overlap_n_left_move<QLinuxFbDevice::Output*,long_long>
               (Output *first,longlong n,Output *d_first)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  Data *pDVar6;
  _drmModeModeInfo *p_Var7;
  Data *pDVar8;
  QKmsPlane *pQVar9;
  undefined8 uVar10;
  qreal qVar11;
  qreal qVar12;
  drmModePropertyPtr p_Var13;
  drmModePropertyBlobPtr p_Var14;
  QSize QVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  Output *pOVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  undefined4 uVar21;
  int iVar22;
  int iVar23;
  bool bVar24;
  undefined7 uVar25;
  undefined3 uVar26;
  undefined3 uVar27;
  bool bVar28;
  undefined3 uVar29;
  uint32_t uVar30;
  bool bVar31;
  uint32_t uVar32;
  Output *pOVar33;
  Output *pOVar34;
  Output *pOVar35;
  QImage *pQVar36;
  QImage *this;
  long lVar37;
  QImage *other;
  long in_FS_OFFSET;
  Destructor local_58;
  Output *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.iter = &local_40;
  local_58.intermediate = (Output *)&DAT_aaaaaaaaaaaaaaaa;
  pOVar35 = d_first + n;
  pOVar34 = first;
  pOVar18 = pOVar35;
  if (first < pOVar35) {
    pOVar34 = pOVar35;
    pOVar18 = first;
  }
  local_58.end = d_first;
  local_40 = d_first;
  if (d_first != pOVar18) {
    do {
      pOVar33 = local_40;
      pDVar3 = (first->kmsOutput).name.d.d;
      (first->kmsOutput).name.d.d = (Data *)0x0;
      (local_40->kmsOutput).name.d.d = pDVar3;
      pcVar4 = (first->kmsOutput).name.d.ptr;
      (first->kmsOutput).name.d.ptr = (char16_t *)0x0;
      (local_40->kmsOutput).name.d.ptr = pcVar4;
      qVar5 = (first->kmsOutput).name.d.size;
      (first->kmsOutput).name.d.size = 0;
      (local_40->kmsOutput).name.d.size = qVar5;
      uVar19 = (first->kmsOutput).crtc_index;
      uVar20 = (first->kmsOutput).crtc_id;
      uVar21 = *(undefined4 *)&(first->kmsOutput).field_0x24;
      qVar11 = (first->kmsOutput).physical_size.wd;
      qVar12 = (first->kmsOutput).physical_size.ht;
      iVar22 = (first->kmsOutput).preferred_mode;
      iVar23 = (first->kmsOutput).mode;
      bVar24 = (first->kmsOutput).mode_set;
      uVar25 = *(undefined7 *)&(first->kmsOutput).field_0x41;
      (local_40->kmsOutput).connector_id = (first->kmsOutput).connector_id;
      (local_40->kmsOutput).crtc_index = uVar19;
      (local_40->kmsOutput).crtc_id = uVar20;
      *(undefined4 *)&(local_40->kmsOutput).field_0x24 = uVar21;
      (local_40->kmsOutput).physical_size.wd = qVar11;
      (local_40->kmsOutput).physical_size.ht = qVar12;
      (local_40->kmsOutput).preferred_mode = iVar22;
      (local_40->kmsOutput).mode = iVar23;
      (local_40->kmsOutput).mode_set = bVar24;
      *(undefined7 *)&(local_40->kmsOutput).field_0x41 = uVar25;
      (local_40->kmsOutput).saved_crtc = (first->kmsOutput).saved_crtc;
      pDVar6 = (first->kmsOutput).modes.d.d;
      (first->kmsOutput).modes.d.d = (Data *)0x0;
      (local_40->kmsOutput).modes.d.d = pDVar6;
      p_Var7 = (first->kmsOutput).modes.d.ptr;
      (first->kmsOutput).modes.d.ptr = (_drmModeModeInfo *)0x0;
      (local_40->kmsOutput).modes.d.ptr = p_Var7;
      qVar5 = (first->kmsOutput).modes.d.size;
      (first->kmsOutput).modes.d.size = 0;
      (local_40->kmsOutput).modes.d.size = qVar5;
      uVar21 = *(undefined4 *)&(first->kmsOutput).field_0x6c;
      p_Var13 = (first->kmsOutput).dpms_prop;
      p_Var14 = (first->kmsOutput).edid_blob;
      bVar24 = (first->kmsOutput).wants_forced_plane;
      uVar26 = *(undefined3 *)&(first->kmsOutput).field_0x81;
      uVar19 = (first->kmsOutput).forced_plane_id;
      uVar27 = *(undefined3 *)&(first->kmsOutput).field_0x81;
      uVar20 = (first->kmsOutput).forced_plane_id;
      bVar28 = (first->kmsOutput).forced_plane_set;
      uVar29 = *(undefined3 *)&(first->kmsOutput).field_0x89;
      uVar30 = (first->kmsOutput).drm_format;
      bVar31 = (first->kmsOutput).drm_format_requested_by_user;
      (local_40->kmsOutput).subpixel = (first->kmsOutput).subpixel;
      *(undefined4 *)&(local_40->kmsOutput).field_0x6c = uVar21;
      (local_40->kmsOutput).dpms_prop = p_Var13;
      (local_40->kmsOutput).edid_blob = p_Var14;
      (local_40->kmsOutput).wants_forced_plane = bVar24;
      *(undefined3 *)&(local_40->kmsOutput).field_0x81 = uVar26;
      (local_40->kmsOutput).forced_plane_id = uVar19;
      *(undefined3 *)&(local_40->kmsOutput).field_0x81 = uVar27;
      (local_40->kmsOutput).forced_plane_id = uVar20;
      (local_40->kmsOutput).forced_plane_set = bVar28;
      *(undefined3 *)&(local_40->kmsOutput).field_0x89 = uVar29;
      (local_40->kmsOutput).drm_format = uVar30;
      (local_40->kmsOutput).drm_format_requested_by_user = bVar31;
      pDVar3 = (first->kmsOutput).clone_source.d.d;
      (first->kmsOutput).clone_source.d.d = (Data *)0x0;
      (local_40->kmsOutput).clone_source.d.d = pDVar3;
      pcVar4 = (first->kmsOutput).clone_source.d.ptr;
      (first->kmsOutput).clone_source.d.ptr = (char16_t *)0x0;
      (local_40->kmsOutput).clone_source.d.ptr = pcVar4;
      qVar5 = (first->kmsOutput).clone_source.d.size;
      (first->kmsOutput).clone_source.d.size = 0;
      (local_40->kmsOutput).clone_source.d.size = qVar5;
      pDVar8 = (first->kmsOutput).available_planes.d.d;
      (first->kmsOutput).available_planes.d.d = (Data *)0x0;
      (local_40->kmsOutput).available_planes.d.d = pDVar8;
      pQVar9 = (first->kmsOutput).available_planes.d.ptr;
      (first->kmsOutput).available_planes.d.ptr = (QKmsPlane *)0x0;
      (local_40->kmsOutput).available_planes.d.ptr = pQVar9;
      qVar5 = (first->kmsOutput).available_planes.d.size;
      (first->kmsOutput).available_planes.d.size = 0;
      (local_40->kmsOutput).available_planes.d.size = qVar5;
      QVar15 = (first->kmsOutput).size;
      uVar19 = (first->kmsOutput).crtcIdPropertyId;
      uVar20 = (first->kmsOutput).modeIdPropertyId;
      uVar30 = (first->kmsOutput).activePropertyId;
      uVar32 = (first->kmsOutput).mode_blob_id;
      (local_40->kmsOutput).eglfs_plane = (first->kmsOutput).eglfs_plane;
      (local_40->kmsOutput).size = QVar15;
      (local_40->kmsOutput).crtcIdPropertyId = uVar19;
      (local_40->kmsOutput).modeIdPropertyId = uVar20;
      (local_40->kmsOutput).activePropertyId = uVar30;
      (local_40->kmsOutput).mode_blob_id = uVar32;
      lVar37 = 0;
      do {
        puVar1 = (undefined8 *)((long)&first->fb[0].handle + lVar37);
        uVar10 = *puVar1;
        uVar16 = puVar1[1];
        puVar2 = (undefined8 *)((long)&first->fb[0].fb + lVar37);
        uVar17 = puVar2[1];
        puVar1 = (undefined8 *)((long)&pOVar33->fb[0].fb + lVar37);
        *puVar1 = *puVar2;
        puVar1[1] = uVar17;
        puVar1 = (undefined8 *)((long)&pOVar33->fb[0].handle + lVar37);
        *puVar1 = uVar10;
        puVar1[1] = uVar16;
        QPaintDevice::QPaintDevice((QPaintDevice *)(&pOVar33->fb[0].wrapper + lVar37));
        *(code **)(&pOVar33->fb[0].wrapper + lVar37) = QStringView::split;
        uVar10 = *(undefined8 *)(&first->fb[0].field_0x30 + lVar37);
        *(undefined8 *)(&first->fb[0].field_0x30 + lVar37) = 0;
        *(undefined8 *)(&pOVar33->fb[0].field_0x30 + lVar37) = uVar10;
        lVar37 = lVar37 + 0x38;
      } while (lVar37 != 0x70);
      lVar37 = 0x2b;
      do {
        pDVar3 = (&(first->kmsOutput).name.d.d)[lVar37];
        (&(first->kmsOutput).name.d.d)[lVar37] = (Data *)&QRegion::shared_empty;
        (&(pOVar33->kmsOutput).name.d.d)[lVar37] = pDVar3;
        lVar37 = lVar37 + 1;
      } while (lVar37 != 0x2d);
      pOVar33->flipped = first->flipped;
      pOVar33->backFb = first->backFb;
      local_40 = local_40 + 1;
      first = first + 1;
    } while (local_40 != pOVar18);
  }
  local_58.intermediate = *local_58.iter;
  local_58.iter = &local_58.intermediate;
  if (local_40 != pOVar35) {
    pQVar36 = &first->fb[0].wrapper;
    do {
      pOVar18 = local_40;
      pDVar3 = (local_40->kmsOutput).name.d.d;
      (local_40->kmsOutput).name.d.d = (first->kmsOutput).name.d.d;
      (first->kmsOutput).name.d.d = pDVar3;
      pcVar4 = (local_40->kmsOutput).name.d.ptr;
      (local_40->kmsOutput).name.d.ptr = (first->kmsOutput).name.d.ptr;
      (first->kmsOutput).name.d.ptr = pcVar4;
      qVar5 = (local_40->kmsOutput).name.d.size;
      (local_40->kmsOutput).name.d.size = (first->kmsOutput).name.d.size;
      (first->kmsOutput).name.d.size = qVar5;
      (local_40->kmsOutput).saved_crtc = (first->kmsOutput).saved_crtc;
      uVar19 = (first->kmsOutput).connector_id;
      uVar20 = (first->kmsOutput).crtc_index;
      uVar30 = (first->kmsOutput).crtc_id;
      uVar21 = *(undefined4 *)&(first->kmsOutput).field_0x24;
      qVar11 = (first->kmsOutput).physical_size.wd;
      qVar12 = (first->kmsOutput).physical_size.ht;
      iVar22 = (first->kmsOutput).mode;
      bVar24 = (first->kmsOutput).mode_set;
      uVar25 = *(undefined7 *)&(first->kmsOutput).field_0x41;
      (pOVar18->kmsOutput).preferred_mode = (first->kmsOutput).preferred_mode;
      (pOVar18->kmsOutput).mode = iVar22;
      (pOVar18->kmsOutput).mode_set = bVar24;
      *(undefined7 *)&(pOVar18->kmsOutput).field_0x41 = uVar25;
      (local_40->kmsOutput).physical_size.wd = qVar11;
      (local_40->kmsOutput).physical_size.ht = qVar12;
      (pOVar18->kmsOutput).connector_id = uVar19;
      (pOVar18->kmsOutput).crtc_index = uVar20;
      (pOVar18->kmsOutput).crtc_id = uVar30;
      *(undefined4 *)&(pOVar18->kmsOutput).field_0x24 = uVar21;
      QArrayDataPointer<_drmModeModeInfo>::operator=
                (&(local_40->kmsOutput).modes.d,&(first->kmsOutput).modes.d);
      uVar21 = *(undefined4 *)&(first->kmsOutput).field_0x6c;
      p_Var13 = (first->kmsOutput).dpms_prop;
      p_Var14 = (first->kmsOutput).edid_blob;
      bVar24 = (first->kmsOutput).wants_forced_plane;
      uVar26 = *(undefined3 *)&(first->kmsOutput).field_0x81;
      uVar19 = (first->kmsOutput).forced_plane_id;
      uVar27 = *(undefined3 *)&(first->kmsOutput).field_0x81;
      uVar20 = (first->kmsOutput).forced_plane_id;
      bVar28 = (first->kmsOutput).forced_plane_set;
      uVar29 = *(undefined3 *)&(first->kmsOutput).field_0x89;
      uVar30 = (first->kmsOutput).drm_format;
      bVar31 = (first->kmsOutput).drm_format_requested_by_user;
      (pOVar18->kmsOutput).subpixel = (first->kmsOutput).subpixel;
      *(undefined4 *)&(pOVar18->kmsOutput).field_0x6c = uVar21;
      (pOVar18->kmsOutput).dpms_prop = p_Var13;
      (pOVar18->kmsOutput).edid_blob = p_Var14;
      (pOVar18->kmsOutput).wants_forced_plane = bVar24;
      *(undefined3 *)&(pOVar18->kmsOutput).field_0x81 = uVar26;
      (pOVar18->kmsOutput).forced_plane_id = uVar19;
      *(undefined3 *)&(pOVar18->kmsOutput).field_0x81 = uVar27;
      (pOVar18->kmsOutput).forced_plane_id = uVar20;
      (pOVar18->kmsOutput).forced_plane_set = bVar28;
      *(undefined3 *)&(pOVar18->kmsOutput).field_0x89 = uVar29;
      (pOVar18->kmsOutput).drm_format = uVar30;
      (pOVar18->kmsOutput).drm_format_requested_by_user = bVar31;
      pDVar3 = (pOVar18->kmsOutput).clone_source.d.d;
      (pOVar18->kmsOutput).clone_source.d.d = (first->kmsOutput).clone_source.d.d;
      (first->kmsOutput).clone_source.d.d = pDVar3;
      pcVar4 = (pOVar18->kmsOutput).clone_source.d.ptr;
      (pOVar18->kmsOutput).clone_source.d.ptr = (first->kmsOutput).clone_source.d.ptr;
      (first->kmsOutput).clone_source.d.ptr = pcVar4;
      qVar5 = (pOVar18->kmsOutput).clone_source.d.size;
      (pOVar18->kmsOutput).clone_source.d.size = (first->kmsOutput).clone_source.d.size;
      (first->kmsOutput).clone_source.d.size = qVar5;
      QArrayDataPointer<QKmsPlane>::operator=
                (&(pOVar18->kmsOutput).available_planes.d,&(first->kmsOutput).available_planes.d);
      QVar15 = (first->kmsOutput).size;
      uVar19 = (first->kmsOutput).crtcIdPropertyId;
      uVar20 = (first->kmsOutput).modeIdPropertyId;
      uVar30 = (first->kmsOutput).activePropertyId;
      uVar32 = (first->kmsOutput).mode_blob_id;
      (pOVar18->kmsOutput).eglfs_plane = (first->kmsOutput).eglfs_plane;
      (pOVar18->kmsOutput).size = QVar15;
      (pOVar18->kmsOutput).crtcIdPropertyId = uVar19;
      (pOVar18->kmsOutput).modeIdPropertyId = uVar20;
      (pOVar18->kmsOutput).activePropertyId = uVar30;
      (pOVar18->kmsOutput).mode_blob_id = uVar32;
      this = &pOVar18->fb[0].wrapper;
      lVar37 = 2;
      other = pQVar36;
      do {
        uVar10 = *(undefined8 *)(other + -0x20);
        uVar16 = *(undefined8 *)(other + -0x18);
        uVar17 = *(undefined8 *)(other + -8);
        *(undefined8 *)(this + -0x10) = *(undefined8 *)(other + -0x10);
        *(undefined8 *)(this + -8) = uVar17;
        *(undefined8 *)(this + -0x20) = uVar10;
        *(undefined8 *)(this + -0x18) = uVar16;
        QImage::operator=(this,other);
        other = other + 0x38;
        this = this + 0x38;
        lVar37 = lVar37 + -1;
      } while (lVar37 != 0);
      lVar37 = 0x2b;
      do {
        pDVar3 = (&(pOVar18->kmsOutput).name.d.d)[lVar37];
        (&(pOVar18->kmsOutput).name.d.d)[lVar37] = (&(first->kmsOutput).name.d.d)[lVar37];
        (&(first->kmsOutput).name.d.d)[lVar37] = pDVar3;
        lVar37 = lVar37 + 1;
      } while (lVar37 != 0x2d);
      pOVar18->flipped = first->flipped;
      pOVar18->backFb = first->backFb;
      local_40 = local_40 + 1;
      first = first + 1;
      pQVar36 = pQVar36 + 0x170;
    } while (local_40 != pOVar35);
  }
  local_58.iter = &local_58.end;
  while (first != pOVar34) {
    first = first + -1;
    QLinuxFbDevice::Output::~Output(first);
  }
  q_relocate_overlap_n_left_move<QLinuxFbDevice::Output_*,_long_long>::Destructor::~Destructor
            (&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}